

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O2

int Cbs_ManSolve2(Cbs_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pObj2)

{
  int *piVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj_00;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  s_Counter = 0;
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x3ce,"int Cbs_ManSolve2(Cbs_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if (((p->pJust).iHead == 0) && ((p->pJust).iTail == 0)) {
    if (((p->pClauses).iHead == 1) && ((p->pClauses).iTail == 1)) {
      (p->Pars).nJustThis = 0;
      (p->Pars).nBTThis = 0;
      (p->Pars).nBTThisNc = 0;
      Cbs_ManAssign(p,pObj,0,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
      if (pObj2 != (Gia_Obj_t *)0x0) {
        Cbs_ManAssign(p,pObj2,0,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
      }
      iVar3 = Cbs_ManSolve_rec(p,0);
      uVar4 = 1;
      if (iVar3 == 0) {
        iVar3 = Cbs_ManCheckLimits(p);
        if (iVar3 == 0) {
          p_00 = p->vModel;
          p_00->nSize = 0;
          (p->pProp).iHead = 0;
          for (lVar5 = 0;
              (lVar5 < (p->pProp).iTail &&
              (pObj_00 = (p->pProp).pData[lVar5], pObj_00 != (Gia_Obj_t *)0x0)); lVar5 = lVar5 + 1)
          {
            iVar3 = Gia_ObjId(p->pAig,pObj_00);
            uVar4 = Cbs_VarValue(pObj_00);
            iVar3 = Abc_Var2Lit(iVar3,uVar4 ^ 1);
            Vec_IntPush(p_00,iVar3);
          }
          uVar4 = 0;
        }
      }
      Cbs_ManCancelUntil(p,0);
      (p->pJust).iHead = 0;
      (p->pJust).iTail = 0;
      (p->pClauses).iHead = 1;
      (p->pClauses).iTail = 1;
      iVar3 = (p->Pars).nJustThis;
      piVar1 = &(p->Pars).nBTTotal;
      *piVar1 = *piVar1 + (p->Pars).nBTThis;
      iVar2 = (p->Pars).nJustTotal;
      if (iVar3 < iVar2) {
        iVar3 = iVar2;
      }
      (p->Pars).nJustTotal = iVar3;
      iVar3 = Cbs_ManCheckLimits(p);
      return -(uint)(iVar3 != 0) | uVar4;
    }
    __assert_fail("p->pClauses.iHead == 1 && p->pClauses.iTail == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x3d0,"int Cbs_ManSolve2(Cbs_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                ,0x3cf,"int Cbs_ManSolve2(Cbs_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
}

Assistant:

int Cbs_ManSolve2( Cbs_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pObj2 )
{
    int RetValue = 0;
    s_Counter = 0;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    assert( p->pClauses.iHead == 1 && p->pClauses.iTail == 1 );
    p->Pars.nBTThis = p->Pars.nJustThis = p->Pars.nBTThisNc = 0;
    Cbs_ManAssign( p, pObj, 0, NULL, NULL );
    if ( pObj2 ) 
    Cbs_ManAssign( p, pObj2, 0, NULL, NULL );
    if ( !Cbs_ManSolve_rec(p, 0) && !Cbs_ManCheckLimits(p) )
        Cbs_ManSaveModelAll( p, p->vModel );
    else
        RetValue = 1;
    Cbs_ManCancelUntil( p, 0 );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Cbs_ManCheckLimits( p ) )
        RetValue = -1;
//    printf( "%d ", s_Counter );
    return RetValue;
}